

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void wallet::coinselector_tests::bnb_search_test_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffecc8;
  std_string *in_stack_ffffffffffffecd0;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffecd8;
  const_string *in_stack_ffffffffffffecf0;
  size_t in_stack_ffffffffffffecf8;
  undefined1 *__s;
  const_string *in_stack_ffffffffffffed00;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffed08;
  undefined1 local_1140 [320];
  undefined8 local_1000;
  undefined1 local_fa8 [408];
  undefined1 local_e10 [408];
  undefined1 local_c78 [408];
  bnb_search_test t;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [16])in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [15])in_stack_ffffffffffffecd0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecd8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,
             in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  bnb_search_test::bnb_search_test((bnb_search_test *)in_stack_ffffffffffffecc8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  memset(local_c78,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [16])in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [16])in_stack_ffffffffffffecd0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecd8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,
             in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::unit_test::setup_conditional<wallet::coinselector_tests::bnb_search_test>
            ((bnb_search_test *)0xd51c0d);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  memset(local_e10,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [16])in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [13])in_stack_ffffffffffffecd0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecd8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,
             in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  bnb_search_test::test_method(&t);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  memset(local_fa8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [16])in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [19])in_stack_ffffffffffffecd0);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecd8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,
             in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::unit_test::teardown_conditional<wallet::coinselector_tests::bnb_search_test>
            ((bnb_search_test *)0xd51e57);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  __s = local_1140;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  msg = boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [16])in_stack_ffffffffffffecd0);
  this_00 = boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [15])in_stack_ffffffffffffecd0);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  bnb_search_test::~bnb_search_test((bnb_search_test *)in_stack_ffffffffffffecc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bnb_search_test)
{
    FastRandomContext rand{};
    // Setup
    std::vector<COutput> utxo_pool;
    SelectionResult expected_result(CAmount(0), SelectionAlgorithm::BNB);

    /////////////////////////
    // Known Outcome tests //
    /////////////////////////

    // Empty utxo pool
    BOOST_CHECK(!SelectCoinsBnB(GroupCoins(utxo_pool), 1 * CENT, 0.5 * CENT));

    // Add utxos
    add_coin(1 * CENT, 1, utxo_pool);
    add_coin(2 * CENT, 2, utxo_pool);
    add_coin(3 * CENT, 3, utxo_pool);
    add_coin(4 * CENT, 4, utxo_pool);

    // Select 1 Cent
    add_coin(1 * CENT, 1, expected_result);
    const auto result1 = SelectCoinsBnB(GroupCoins(utxo_pool), 1 * CENT, 0.5 * CENT);
    BOOST_CHECK(result1);
    BOOST_CHECK(EquivalentResult(expected_result, *result1));
    BOOST_CHECK_EQUAL(result1->GetSelectedValue(), 1 * CENT);
    expected_result.Clear();

    // Select 2 Cent
    add_coin(2 * CENT, 2, expected_result);
    const auto result2 = SelectCoinsBnB(GroupCoins(utxo_pool), 2 * CENT, 0.5 * CENT);
    BOOST_CHECK(result2);
    BOOST_CHECK(EquivalentResult(expected_result, *result2));
    BOOST_CHECK_EQUAL(result2->GetSelectedValue(), 2 * CENT);
    expected_result.Clear();

    // Select 5 Cent
    add_coin(3 * CENT, 3, expected_result);
    add_coin(2 * CENT, 2, expected_result);
    const auto result3 = SelectCoinsBnB(GroupCoins(utxo_pool), 5 * CENT, 0.5 * CENT);
    BOOST_CHECK(result3);
    BOOST_CHECK(EquivalentResult(expected_result, *result3));
    BOOST_CHECK_EQUAL(result3->GetSelectedValue(), 5 * CENT);
    expected_result.Clear();

    // Select 11 Cent, not possible
    BOOST_CHECK(!SelectCoinsBnB(GroupCoins(utxo_pool), 11 * CENT, 0.5 * CENT));
    expected_result.Clear();

    // Cost of change is greater than the difference between target value and utxo sum
    add_coin(1 * CENT, 1, expected_result);
    const auto result4 = SelectCoinsBnB(GroupCoins(utxo_pool), 0.9 * CENT, 0.5 * CENT);
    BOOST_CHECK(result4);
    BOOST_CHECK_EQUAL(result4->GetSelectedValue(), 1 * CENT);
    BOOST_CHECK(EquivalentResult(expected_result, *result4));
    expected_result.Clear();

    // Cost of change is less than the difference between target value and utxo sum
    BOOST_CHECK(!SelectCoinsBnB(GroupCoins(utxo_pool), 0.9 * CENT, 0));
    expected_result.Clear();

    // Select 10 Cent
    add_coin(5 * CENT, 5, utxo_pool);
    add_coin(4 * CENT, 4, expected_result);
    add_coin(3 * CENT, 3, expected_result);
    add_coin(2 * CENT, 2, expected_result);
    add_coin(1 * CENT, 1, expected_result);
    const auto result5 = SelectCoinsBnB(GroupCoins(utxo_pool), 10 * CENT, 0.5 * CENT);
    BOOST_CHECK(result5);
    BOOST_CHECK(EquivalentResult(expected_result, *result5));
    BOOST_CHECK_EQUAL(result5->GetSelectedValue(), 10 * CENT);
    expected_result.Clear();

    // Select 0.25 Cent, not possible
    BOOST_CHECK(!SelectCoinsBnB(GroupCoins(utxo_pool), 0.25 * CENT, 0.5 * CENT));
    expected_result.Clear();

    // Iteration exhaustion test
    CAmount target = make_hard_case(17, utxo_pool);
    BOOST_CHECK(!SelectCoinsBnB(GroupCoins(utxo_pool), target, 1)); // Should exhaust
    target = make_hard_case(14, utxo_pool);
    const auto result7 = SelectCoinsBnB(GroupCoins(utxo_pool), target, 1); // Should not exhaust
    BOOST_CHECK(result7);

    // Test same value early bailout optimization
    utxo_pool.clear();
    add_coin(7 * CENT, 7, expected_result);
    add_coin(7 * CENT, 7, expected_result);
    add_coin(7 * CENT, 7, expected_result);
    add_coin(7 * CENT, 7, expected_result);
    add_coin(2 * CENT, 7, expected_result);
    add_coin(7 * CENT, 7, utxo_pool);
    add_coin(7 * CENT, 7, utxo_pool);
    add_coin(7 * CENT, 7, utxo_pool);
    add_coin(7 * CENT, 7, utxo_pool);
    add_coin(2 * CENT, 7, utxo_pool);
    for (int i = 0; i < 50000; ++i) {
        add_coin(5 * CENT, 7, utxo_pool);
    }
    const auto result8 = SelectCoinsBnB(GroupCoins(utxo_pool), 30 * CENT, 5000);
    BOOST_CHECK(result8);
    BOOST_CHECK_EQUAL(result8->GetSelectedValue(), 30 * CENT);
    BOOST_CHECK(EquivalentResult(expected_result, *result8));

    ////////////////////
    // Behavior tests //
    ////////////////////
    // Select 1 Cent with pool of only greater than 5 Cent
    utxo_pool.clear();
    for (int i = 5; i <= 20; ++i) {
        add_coin(i * CENT, i, utxo_pool);
    }
    // Run 100 times, to make sure it is never finding a solution
    for (int i = 0; i < 100; ++i) {
        BOOST_CHECK(!SelectCoinsBnB(GroupCoins(utxo_pool), 1 * CENT, 2 * CENT));
    }

    // Make sure that effective value is working in AttemptSelection when BnB is used
    CoinSelectionParams coin_selection_params_bnb{
        rand,
        /*change_output_size=*/ 31,
        /*change_spend_size=*/ 68,
        /*min_change_target=*/ 0,
        /*effective_feerate=*/ CFeeRate(3000),
        /*long_term_feerate=*/ CFeeRate(1000),
        /*discard_feerate=*/ CFeeRate(1000),
        /*tx_noinputs_size=*/ 0,
        /*avoid_partial=*/ false,
    };
    coin_selection_params_bnb.m_change_fee = coin_selection_params_bnb.m_effective_feerate.GetFee(coin_selection_params_bnb.change_output_size);
    coin_selection_params_bnb.m_cost_of_change = coin_selection_params_bnb.m_effective_feerate.GetFee(coin_selection_params_bnb.change_spend_size) + coin_selection_params_bnb.m_change_fee;
    coin_selection_params_bnb.min_viable_change = coin_selection_params_bnb.m_effective_feerate.GetFee(coin_selection_params_bnb.change_spend_size);

    {
        std::unique_ptr<CWallet> wallet = NewWallet(m_node);

        CoinsResult available_coins;

        add_coin(available_coins, *wallet, 1, coin_selection_params_bnb.m_effective_feerate);
        available_coins.All().at(0).input_bytes = 40; // Make sure that it has a negative effective value. The next check should assert if this somehow got through. Otherwise it will fail
        BOOST_CHECK(!SelectCoinsBnB(GroupCoins(available_coins.All()), 1 * CENT, coin_selection_params_bnb.m_cost_of_change));

        // Test fees subtracted from output:
        available_coins.Clear();
        add_coin(available_coins, *wallet, 1 * CENT, coin_selection_params_bnb.m_effective_feerate);
        available_coins.All().at(0).input_bytes = 40;
        const auto result9 = SelectCoinsBnB(GroupCoins(available_coins.All()), 1 * CENT, coin_selection_params_bnb.m_cost_of_change);
        BOOST_CHECK(result9);
        BOOST_CHECK_EQUAL(result9->GetSelectedValue(), 1 * CENT);
    }

    {
        std::unique_ptr<CWallet> wallet = NewWallet(m_node);

        CoinsResult available_coins;

        coin_selection_params_bnb.m_effective_feerate = CFeeRate(0);
        add_coin(available_coins, *wallet, 5 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 3 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 2 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        CCoinControl coin_control;
        coin_control.m_allow_other_inputs = true;
        COutput select_coin = available_coins.All().at(0);
        coin_control.Select(select_coin.outpoint);
        PreSelectedInputs selected_input;
        selected_input.Insert(select_coin, coin_selection_params_bnb.m_subtract_fee_outputs);
        available_coins.Erase({available_coins.coins[OutputType::BECH32].begin()->outpoint});

        LOCK(wallet->cs_wallet);
        const auto result10 = SelectCoins(*wallet, available_coins, selected_input, 10 * CENT, coin_control, coin_selection_params_bnb);
        BOOST_CHECK(result10);
    }
    {
        std::unique_ptr<CWallet> wallet = NewWallet(m_node);
        LOCK(wallet->cs_wallet); // Every 'SelectCoins' call requires it

        CoinsResult available_coins;

        // single coin should be selected when effective fee > long term fee
        coin_selection_params_bnb.m_effective_feerate = CFeeRate(5000);
        coin_selection_params_bnb.m_long_term_feerate = CFeeRate(3000);

        // Add selectable outputs, increasing their raw amounts by their input fee to make the effective value equal to the raw amount
        CAmount input_fee = coin_selection_params_bnb.m_effective_feerate.GetFee(/*num_bytes=*/68); // bech32 input size (default test output type)
        add_coin(available_coins, *wallet, 10 * CENT + input_fee, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 9 * CENT + input_fee, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 1 * CENT + input_fee, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);

        expected_result.Clear();
        add_coin(10 * CENT + input_fee, 2, expected_result);
        CCoinControl coin_control;
        const auto result11 = SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/{}, 10 * CENT, coin_control, coin_selection_params_bnb);
        BOOST_CHECK(EquivalentResult(expected_result, *result11));
        available_coins.Clear();

        // more coins should be selected when effective fee < long term fee
        coin_selection_params_bnb.m_effective_feerate = CFeeRate(3000);
        coin_selection_params_bnb.m_long_term_feerate = CFeeRate(5000);

        // Add selectable outputs, increasing their raw amounts by their input fee to make the effective value equal to the raw amount
        input_fee = coin_selection_params_bnb.m_effective_feerate.GetFee(/*num_bytes=*/68); // bech32 input size (default test output type)
        add_coin(available_coins, *wallet, 10 * CENT + input_fee, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 9 * CENT + input_fee, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 1 * CENT + input_fee, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);

        expected_result.Clear();
        add_coin(9 * CENT + input_fee, 2, expected_result);
        add_coin(1 * CENT + input_fee, 2, expected_result);
        const auto result12 = SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/{}, 10 * CENT, coin_control, coin_selection_params_bnb);
        BOOST_CHECK(EquivalentResult(expected_result, *result12));
        available_coins.Clear();

        // pre selected coin should be selected even if disadvantageous
        coin_selection_params_bnb.m_effective_feerate = CFeeRate(5000);
        coin_selection_params_bnb.m_long_term_feerate = CFeeRate(3000);

        // Add selectable outputs, increasing their raw amounts by their input fee to make the effective value equal to the raw amount
        input_fee = coin_selection_params_bnb.m_effective_feerate.GetFee(/*num_bytes=*/68); // bech32 input size (default test output type)
        add_coin(available_coins, *wallet, 10 * CENT + input_fee, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 9 * CENT + input_fee, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 1 * CENT + input_fee, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);

        expected_result.Clear();
        add_coin(9 * CENT + input_fee, 2, expected_result);
        add_coin(1 * CENT + input_fee, 2, expected_result);
        coin_control.m_allow_other_inputs = true;
        COutput select_coin = available_coins.All().at(1); // pre select 9 coin
        coin_control.Select(select_coin.outpoint);
        PreSelectedInputs selected_input;
        selected_input.Insert(select_coin, coin_selection_params_bnb.m_subtract_fee_outputs);
        available_coins.Erase({(++available_coins.coins[OutputType::BECH32].begin())->outpoint});
        const auto result13 = SelectCoins(*wallet, available_coins, selected_input, 10 * CENT, coin_control, coin_selection_params_bnb);
        BOOST_CHECK(EquivalentResult(expected_result, *result13));
    }

    {
        // Test bnb max weight exceeded
        // Inputs set [10, 9, 8, 5, 3, 1], Selection Target = 16 and coin 5 exceeding the max weight.

        std::unique_ptr<CWallet> wallet = NewWallet(m_node);

        CoinsResult available_coins;
        add_coin(available_coins, *wallet, 10 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 9 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 8 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 5 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true, /*custom_size=*/MAX_STANDARD_TX_WEIGHT);
        add_coin(available_coins, *wallet, 3 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        add_coin(available_coins, *wallet, 1 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);

        CAmount selection_target = 16 * CENT;
        const auto& no_res = SelectCoinsBnB(GroupCoins(available_coins.All(), /*subtract_fee_outputs*/true),
                                            selection_target, /*cost_of_change=*/0, MAX_STANDARD_TX_WEIGHT);
        BOOST_REQUIRE(!no_res);
        BOOST_CHECK(util::ErrorString(no_res).original.find("The inputs size exceeds the maximum weight") != std::string::npos);

        // Now add same coin value with a good size and check that it gets selected
        add_coin(available_coins, *wallet, 5 * CENT, coin_selection_params_bnb.m_effective_feerate, 6 * 24, false, 0, true);
        const auto& res = SelectCoinsBnB(GroupCoins(available_coins.All(), /*subtract_fee_outputs*/true), selection_target, /*cost_of_change=*/0);

        expected_result.Clear();
        add_coin(8 * CENT, 2, expected_result);
        add_coin(5 * CENT, 2, expected_result);
        add_coin(3 * CENT, 2, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
    }
}